

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O2

string * __thiscall
gflags::(anonymous_namespace)::FlagValue::ToString_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  uint uVar1;
  undefined8 uVar2;
  char *pcVar3;
  allocator *paVar4;
  allocator local_59;
  char intbuf [64];
  
  switch(*(undefined1 *)((long)this + 8)) {
  case 0:
    pcVar3 = "false";
    if (**this != '\0') {
      pcVar3 = "true";
    }
    paVar4 = (allocator *)intbuf;
    goto LAB_0010c7ca;
  case 1:
    uVar1 = **this;
    pcVar3 = "%d";
    break;
  case 2:
    uVar1 = **this;
    pcVar3 = "%u";
    break;
  case 3:
    uVar2 = **this;
    pcVar3 = "%ld";
    goto LAB_0010c76b;
  case 4:
    uVar2 = **this;
    pcVar3 = "%lu";
LAB_0010c76b:
    snprintf(intbuf,0x40,pcVar3,uVar2);
    goto LAB_0010c7bf;
  case 5:
    snprintf(intbuf,0x40,"%.17g",**this);
    goto LAB_0010c7bf;
  case 6:
    std::__cxx11::string::string((string *)__return_storage_ptr__,*this);
    return __return_storage_ptr__;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/jarulraj[P]sqlcheck/external/gflags/src/gflags.cc"
                  ,0x189,"string gflags::(anonymous namespace)::FlagValue::ToString() const");
  }
  snprintf(intbuf,0x40,pcVar3,(ulong)uVar1);
LAB_0010c7bf:
  pcVar3 = intbuf;
  paVar4 = &local_59;
LAB_0010c7ca:
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,paVar4);
  return __return_storage_ptr__;
}

Assistant:

string FlagValue::ToString() const {
  char intbuf[64];    // enough to hold even the biggest number
  switch (type_) {
    case FV_BOOL:
      return VALUE_AS(bool) ? "true" : "false";
    case FV_INT32:
      snprintf(intbuf, sizeof(intbuf), "%" PRId32, VALUE_AS(int32));
      return intbuf;
    case FV_UINT32:
      snprintf(intbuf, sizeof(intbuf), "%" PRIu32, VALUE_AS(uint32));
      return intbuf;
    case FV_INT64:
      snprintf(intbuf, sizeof(intbuf), "%" PRId64, VALUE_AS(int64));
      return intbuf;
    case FV_UINT64:
      snprintf(intbuf, sizeof(intbuf), "%" PRIu64, VALUE_AS(uint64));
      return intbuf;
    case FV_DOUBLE:
      snprintf(intbuf, sizeof(intbuf), "%.17g", VALUE_AS(double));
      return intbuf;
    case FV_STRING:
      return VALUE_AS(string);
    default:
      assert(false);
      return "";  // unknown type
  }
}